

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrs.h
# Opt level: O2

void Psr_ManVecFree(Vec_Ptr_t *vPrs)

{
  void *__ptr;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vPrs->nSize; i_00 = i_00 + 1) {
    __ptr = Vec_PtrEntry(vPrs,i_00);
    if (*(Abc_Nam_t **)((long)__ptr + 8) != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(*(Abc_Nam_t **)((long)__ptr + 8));
    }
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x10));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x20));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x30));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x40));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x50));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x60));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x70));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x80));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0x90));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xa0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xb0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xc0));
    Vec_IntErase((Vec_Int_t *)((long)__ptr + 0xd0));
    free(__ptr);
  }
  free(vPrs->pArray);
  free(vPrs);
  return;
}

Assistant:

static inline void Psr_ManVecFree( Vec_Ptr_t * vPrs )
{
    Psr_Ntk_t * pNtk; int i;
    Vec_PtrForEachEntry( Psr_Ntk_t *, vPrs, pNtk, i )
        Psr_NtkFree( pNtk );
    Vec_PtrFree( vPrs );
}